

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

GLFWbool waitForEvent(double *timeout)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint64_t uVar5;
  int *piVar6;
  uint64_t uVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  timeval tv;
  fd_set fds;
  
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  iVar2 = _glfw.linjs.inotify;
  if (_glfw.linjs.inotify <= iVar1) {
    iVar2 = iVar1;
  }
  lVar8 = 0;
  while( true ) {
    while( true ) {
      for (; lVar8 != 0x10; lVar8 = lVar8 + 1) {
        fds.__fds_bits[lVar8] = 0;
      }
      fds.__fds_bits[iVar1 / 0x40] = fds.__fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
      if (0 < _glfw.linjs.inotify) {
        fds.__fds_bits[(uint)_glfw.linjs.inotify >> 6] =
             fds.__fds_bits[(uint)_glfw.linjs.inotify >> 6] |
             1L << ((byte)_glfw.linjs.inotify & 0x3f);
      }
      if (timeout != (double *)0x0) break;
      iVar4 = select(iVar2 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if (iVar4 != -1) {
        return 1;
      }
      piVar6 = __errno_location();
      lVar8 = 0;
      if (*piVar6 != 4) {
        return 1;
      }
    }
    tv.tv_sec = (__time_t)*timeout;
    tv.tv_usec = (__suseconds_t)((*timeout - (double)tv.tv_sec) * 1000000.0);
    uVar5 = _glfwPlatformGetTimerValue();
    iVar3 = select(iVar2 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    uVar7 = _glfwPlatformGetTimerValue();
    lVar8 = uVar7 - uVar5;
    auVar10._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = 0x45300000;
    uVar5 = _glfwPlatformGetTimerFrequency();
    auVar11._8_4_ = (int)(uVar5 >> 0x20);
    auVar11._0_8_ = uVar5;
    auVar11._12_4_ = 0x45300000;
    dVar9 = *timeout -
            ((auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
            ((auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
    *timeout = dVar9;
    if (0 < iVar3) {
      return 1;
    }
    lVar8 = 0;
    if (iVar4 == 4 && iVar3 == -1) break;
    if (dVar9 <= 0.0) {
      return 0;
    }
  }
  return 0;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

#if defined(__linux__)
    if (_glfw.linjs.inotify > fd)
        count = _glfw.linjs.inotify + 1;
#endif
    for (;;)
    {
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
#if defined(__linux__)
        if (_glfw.linjs.inotify > 0)
            FD_SET(_glfw.linjs.inotify, &fds);
#endif

        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}